

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void gnuplotio::
     handle_colunwrap_tag<1ul,std::pair<std::vector<float,std::allocator<float>>,std::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>>>,gnuplotio::ModeSize>
               (ulong stream,undefined8 *arg)

{
  range_type range;
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>,_gnuplotio::PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>_>_>
  local_58;
  
  local_58.r.l.l.it._M_current = (double *)arg[0xc];
  local_58.r.l.l.end._M_current = (double *)arg[0xd];
  local_58.l.it._M_current = (float *)*arg;
  local_58.l.end._M_current = (float *)arg[1];
  local_58.r.r.it._M_current = (float *)arg[3];
  local_58.r.r.end._M_current = (float *)arg[4];
  local_58.r.l.r.l.it._M_current = (int *)arg[6];
  local_58.r.l.r.l.end._M_current = (int *)arg[7];
  local_58.r.l.r.r.it._M_current = (int *)arg[9];
  local_58.r.l.r.r.end._M_current = (int *)arg[10];
  get_range_size<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,float>,gnuplotio::PairOfRange<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,float>>>>
            (&local_58);
  std::ostream::_M_insert<unsigned_long>(stream);
  return;
}

Assistant:

void handle_colunwrap_tag(std::ostream &stream, const T &arg, ColUnwrapNo, PrintMode) {
    static_assert(ArrayTraits<T>::depth >= Depth, "container not deep enough");
    typename ArrayTraits<T>::range_type range = ArrayTraits<T>::get_range(arg);
    print_block<Depth>(stream, range, PrintMode());
}